

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
MILBlob::PackSubByteVecImpl<MILBlob::UInt1>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          MILBlob *this,Span<const_unsigned_char,_18446744073709551615UL> vec)

{
  byte *pbVar1;
  byte *pbVar2;
  range_error *this_00;
  SpanSize<18446744073709551615UL> SVar3;
  pointer index;
  double dVar4;
  undefined1 auVar5 [16];
  Span<const_unsigned_char,_18446744073709551615UL> vec_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  SVar3.m_size = (size_t)vec.m_ptr;
  auVar5._8_4_ = vec.m_ptr._4_4_;
  auVar5._0_8_ = SVar3.m_size;
  auVar5._12_4_ = 0x45300000;
  vec_local.m_ptr = (pointer)this;
  vec_local.m_size.m_size = SVar3.m_size;
  dVar4 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)vec.m_ptr) - 4503599627370496.0)) * 0.125);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4,
             (allocator_type *)&local_148);
  index = (pointer)0x0;
  while( true ) {
    if (SVar3.m_size <= index) {
      return __return_storage_ptr__;
    }
    pbVar1 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       (&vec_local,(size_t)index);
    if (1 < *pbVar1) break;
    Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&vec_local,(size_t)index);
    pbVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       (&vec_local,(size_t)index);
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + ((ulong)index >> 3);
    *pbVar1 = *pbVar1 | (*pbVar2 & 1) << ((byte)index & 7);
    index = index + 1;
    SVar3 = vec_local.m_size;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  pbVar1 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                     (&vec_local,(size_t)index);
  std::__cxx11::to_string(&local_e8,(uint)*pbVar1);
  std::operator+(&local_c8,"Value ",&local_e8);
  std::operator+(&local_a8,&local_c8," is outside allowed subbyte datatype range [");
  std::__cxx11::to_string(&local_108,0);
  std::operator+(&local_88,&local_a8,&local_108);
  std::operator+(&local_68,&local_88,", ");
  std::__cxx11::to_string(&local_128,1);
  std::operator+(&local_48,&local_68,&local_128);
  std::operator+(&local_148,&local_48,"].");
  std::range_error::range_error(this_00,(string *)&local_148);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::vector<uint8_t> PackSubByteVecImpl(Util::Span<const decltype(T::data)> vec)
{
    if constexpr (!MILBlob::SubByteIsByteAligned<T>()) {
        return PackSubByteVecForNonByteAligned<T>(vec);
    }
    const auto ElementsPerByte = 8 / T::SizeInBits;
    std::vector<uint8_t> ret(MILBlob::SizeInBytes<T>(vec.Size()));
    for (size_t i = 0; i < vec.Size(); i++) {
        size_t shiftAmmount = T::SizeInBits * (i % ElementsPerByte);
        MILVerifyIsTrue(vec[i] <= T::MAX && vec[i] >= T::MIN,
                        std::range_error,
                        "Value " + std::to_string(vec[i]) + " is outside allowed subbyte datatype range [" +
                            std::to_string(T::MIN) + ", " + std::to_string(T::MAX) + "].");
        ret[i / ElementsPerByte] |= (static_cast<uint8_t>((vec[i] & T::BitMask) << shiftAmmount));
    }
    return ret;
}